

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void Am_Add_Remove_Inter_To_Extra_Window(Am_Object *inter,Am_Object *window,bool add,bool want_move)

{
  bool bVar1;
  int third_priority;
  Am_Value *pAVar2;
  Am_Object *this;
  Am_Object *this_00;
  Am_Object owner;
  Am_Object AStack_68;
  Am_Object local_60;
  int local_58;
  float local_54;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  Am_Object::Get_Object(&AStack_68,(Am_Slot_Key)inter,10);
  bVar1 = Am_Object::Valid(&AStack_68);
  if (bVar1) {
    pAVar2 = Am_Object::Get(inter,0xcd,0);
    local_54 = Am_Value::operator_cast_to_float(pAVar2);
    pAVar2 = Am_Object::Get(&AStack_68,0x86,0);
    local_58 = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(&AStack_68,0x85,0);
    third_priority = Am_Value::operator_cast_to_int(pAVar2);
    if (add) {
      this = &local_38;
      Am_Object::Am_Object(this,inter);
      this_00 = &local_40;
      Am_Object::Am_Object(this_00,window);
      add_priority_list_for_window(this,this_00,local_54,local_58,third_priority,true,true);
    }
    else {
      this = &local_48;
      Am_Object::Am_Object(this,inter);
      this_00 = &local_50;
      Am_Object::Am_Object(this_00,window);
      clear_priority_list_for_window(this,this_00);
    }
    Am_Object::~Am_Object(this_00);
    Am_Object::~Am_Object(this);
  }
  Am_Object::Am_Object(&local_60,window);
  set_want_move_one_win(&local_60,want_move);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&AStack_68);
  return;
}

Assistant:

void
Am_Add_Remove_Inter_To_Extra_Window(Am_Object inter, Am_Object window, bool add,
                                    bool want_move)
{
  Am_Object owner = inter.Get_Owner();
  if (owner.Valid()) {
    float main_priority = inter.Get(Am_PRIORITY);
    int second_priority = owner.Get(Am_OWNER_DEPTH);
    int third_priority = owner.Get(Am_RANK);
    if (add) {
      add_priority_list_for_window(inter, window, main_priority,
                                   second_priority, third_priority, true, true);
    } else
      clear_priority_list_for_window(inter, window);
  }
  set_want_move_one_win(window, want_move);
}